

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O0

void testHimmelblauFunctor(void)

{
  ostream *poVar1;
  void *pvVar2;
  non_const_type local_218;
  Status local_20c;
  undefined1 local_208 [4];
  int ret;
  VectorXd z;
  LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  lm;
  NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0> numDiff;
  HimmelblauFunctor functor;
  Scalar local_60 [3];
  Scalar local_48;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_40;
  int local_1c;
  undefined1 local_18 [8];
  VectorXd zInit;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing f(x,y) = (x^2 + y - 11)^2 + (x + y^2 - 7)^2 function...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1c = 2;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_18,&local_1c);
  local_48 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_40,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_18,&local_48);
  local_60[0] = -1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(&local_40,local_60);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"zInit: ");
  functor.super_Functor<double,__1,__1> =
       (Functor<double,__1,__1>)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_18);
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&functor);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"soln 1: [3.0, 2.0]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"soln 2: [-2.805118, 3.131312]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"soln 3: [-3.77931, -3.28316]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"soln 4: [3.584428, -1.848126]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  HimmelblauFunctor::HimmelblauFunctor((HimmelblauFunctor *)&numDiff.epsfcn);
  Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>::NumericalDiff
            ((NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0> *)&lm.prered,
             (Functor *)&numDiff.epsfcn,0.0);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>::
  LevenbergMarquardt((LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>
                      *)&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows,
                     (NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0> *)&lm.prered);
  lm.parameters.factor = 4.94065645841247e-321;
  lm.parameters.ftol = 1e-10;
  poVar1 = std::operator<<((ostream *)&std::cout,"max fun eval: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(long)lm.parameters.factor);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"x tol: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,lm.parameters.ftol);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_208,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_18);
  local_20c = Eigen::
              LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>
              ::minimize((LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>
                          *)&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,(FVectorType *)local_208);
  poVar1 = std::operator<<((ostream *)&std::cout,"iter count: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,lm.njev);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"return status: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_20c);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"zSolver: ");
  local_218 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_208);
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&local_218);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_208);
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>::
  ~LevenbergMarquardt((LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor,_(Eigen::NumericalDiffMode)0>,_double>
                       *)&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_18);
  return;
}

Assistant:

void testHimmelblauFunctor()
{
    std::cout << "Testing f(x,y) = (x^2 + y - 11)^2 + (x + y^2 - 7)^2 function..." << std::endl;
    // Eigen::VectorXd zInit(2); zInit << 0.0, 0.0;  // soln 1
    // Eigen::VectorXd zInit(2); zInit << -1, 1;  // soln 2
    // Eigen::VectorXd zInit(2); zInit << -1, -1;  // soln 3
    Eigen::VectorXd zInit(2); zInit << 1, -1;  // soln 4
    std::cout << "zInit: " << zInit.transpose() << std::endl;
    std::cout << "soln 1: [3.0, 2.0]" << std::endl;
    std::cout << "soln 2: [-2.805118, 3.131312]" << std::endl;
    std::cout << "soln 3: [-3.77931, -3.28316]" << std::endl;
    std::cout << "soln 4: [3.584428, -1.848126]" << std::endl;

    HimmelblauFunctor functor;
    Eigen::NumericalDiff<HimmelblauFunctor> numDiff(functor);
    Eigen::LevenbergMarquardt<Eigen::NumericalDiff<HimmelblauFunctor>,double> lm(numDiff);
    lm.parameters.maxfev = 1000;
    lm.parameters.xtol = 1.0e-10;
    std::cout << "max fun eval: " << lm.parameters.maxfev << std::endl;
    std::cout << "x tol: " << lm.parameters.xtol << std::endl;

    Eigen::VectorXd z = zInit;
    int ret = lm.minimize(z);
    std::cout << "iter count: " << lm.iter << std::endl;
    std::cout << "return status: " << ret << std::endl;
    std::cout << "zSolver: " << z.transpose() << std::endl;
    std::cout << "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~" << std::endl;
}